

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

bool __thiscall Assimp::ColladaParser::ReadBoolFromTextContent(ColladaParser *this)

{
  int iVar1;
  char *s1;
  bool bVar2;
  
  s1 = GetTextContent(this);
  iVar1 = ASSIMP_strincmp(s1,"true",4);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = *s1 != '0';
  }
  return bVar2;
}

Assistant:

bool ColladaParser::ReadBoolFromTextContent()
{
    const char* cur = GetTextContent();
    return (!ASSIMP_strincmp(cur, "true", 4) || '0' != *cur);
}